

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

void __thiscall wabt::interp::Exception::Mark(Exception *this,Store *store)

{
  Index this_00;
  bool bVar1;
  Tag *this_01;
  TagType *pTVar2;
  size_type sVar3;
  reference this_02;
  reference this_03;
  Ref ref;
  ulong local_60;
  size_t i;
  ValueTypes params;
  undefined1 local_30 [8];
  Ptr tag;
  Store *store_local;
  Exception *this_local;
  
  tag.root_index_ = (Index)store;
  RefPtr<wabt::interp::Tag>::RefPtr
            ((RefPtr<wabt::interp::Tag> *)local_30,store,(Ref)(this->tag_).index);
  params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)(this->tag_).index;
  Store::Mark((Store *)tag.root_index_,
              (Ref)params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
  this_01 = RefPtr<wabt::interp::Tag>::operator->((RefPtr<wabt::interp::Tag> *)local_30);
  pTVar2 = Tag::type(this_01);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
            ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)&i,&pTVar2->signature);
  for (local_60 = 0;
      sVar3 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size
                        ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)&i), local_60 < sVar3;
      local_60 = local_60 + 1) {
    this_02 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator[]
                        ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)&i,local_60);
    bVar1 = Type::IsRef(this_02);
    this_00 = tag.root_index_;
    if (bVar1) {
      this_03 = std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::operator[]
                          (&this->args_,local_60);
      ref = Value::Get<wabt::interp::Ref>(this_03);
      Store::Mark((Store *)this_00,ref);
    }
  }
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::~vector
            ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)&i);
  RefPtr<wabt::interp::Tag>::~RefPtr((RefPtr<wabt::interp::Tag> *)local_30);
  return;
}

Assistant:

void Exception::Mark(Store& store) {
  Tag::Ptr tag(store, tag_);
  store.Mark(tag_);
  ValueTypes params = tag->type().signature;
  for (size_t i = 0; i < params.size(); i++) {
    if (params[i].IsRef()) {
      store.Mark(args_[i].Get<Ref>());
    }
  }
}